

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_filter.cpp
# Opt level: O1

string * __thiscall
duckdb::StructFilter::ToString
          (string *__return_storage_ptr__,StructFilter *this,string *column_name)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  pointer pTVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  char cVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  pointer local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ulong *local_88;
  uint local_80;
  undefined4 uStack_7c;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  sVar1 = (this->child_name)._M_string_length;
  pTVar5 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
           operator->(&this->child_filter);
  if (sVar1 != 0) {
    pcVar2 = (column_name->_M_dataplus)._M_p;
    local_c8 = (pointer)&local_b8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar2,pcVar2 + column_name->_M_string_length);
    ::std::__cxx11::string::append((char *)&local_c8);
    plVar6 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_c8,(ulong)(this->child_name)._M_dataplus._M_p);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_98 = *plVar8;
      uStack_90 = (undefined4)plVar6[3];
      uStack_8c = *(undefined4 *)((long)plVar6 + 0x1c);
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar8;
      local_a8 = (long *)*plVar6;
    }
    local_a0 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    (*pTVar5->_vptr_TableFilter[3])(__return_storage_ptr__,pTVar5);
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    local_48._M_dataplus._M_p = local_c8;
    if (local_c8 == (pointer)&local_b8) {
      return __return_storage_ptr__;
    }
    goto LAB_0121d56a;
  }
  ::std::operator+(&local_48,"struct_extract_at(",column_name);
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_48);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_58 = *puVar9;
    lStack_50 = plVar6[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *puVar9;
    local_68 = (ulong *)*plVar6;
  }
  local_60 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar12 = this->child_idx + 1;
  cVar11 = '\x01';
  if (9 < uVar12) {
    uVar10 = uVar12;
    cVar4 = '\x04';
    do {
      cVar11 = cVar4;
      if (uVar10 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_0121d604;
      }
      if (uVar10 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_0121d604;
      }
      if (uVar10 < 10000) goto LAB_0121d604;
      bVar3 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar4 = cVar11 + '\x04';
    } while (bVar3);
    cVar11 = cVar11 + '\x01';
  }
LAB_0121d604:
  local_88 = local_78;
  ::std::__cxx11::string::_M_construct((ulong)&local_88,cVar11);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_88,local_80,uVar12);
  uVar12 = CONCAT44(uStack_7c,local_80) + local_60;
  uVar10 = 0xf;
  if (local_68 != &local_58) {
    uVar10 = local_58;
  }
  if (uVar10 < uVar12) {
    uVar10 = 0xf;
    if (local_88 != local_78) {
      uVar10 = local_78[0];
    }
    if (uVar10 < uVar12) goto LAB_0121d669;
    puVar7 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68);
  }
  else {
LAB_0121d669:
    puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
  }
  local_c8 = (pointer)&local_b8;
  pcVar2 = (pointer)(puVar7 + 2);
  if ((pointer)*puVar7 == pcVar2) {
    local_b8 = *(undefined8 *)pcVar2;
    uStack_b0 = puVar7[3];
  }
  else {
    local_b8 = *(undefined8 *)pcVar2;
    local_c8 = (pointer)*puVar7;
  }
  local_c0 = puVar7[1];
  *puVar7 = pcVar2;
  puVar7[1] = 0;
  *pcVar2 = '\0';
  puVar7 = (undefined8 *)::std::__cxx11::string::append((char *)&local_c8);
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_98 = *plVar6;
    uStack_90 = *(undefined4 *)(puVar7 + 3);
    uStack_8c = *(undefined4 *)((long)puVar7 + 0x1c);
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar6;
    local_a8 = (long *)*puVar7;
  }
  local_a0 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  (*pTVar5->_vptr_TableFilter[3])(__return_storage_ptr__,pTVar5);
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_c8 != (pointer)&local_b8) {
    operator_delete(local_c8);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == &local_48.field_2) {
    return __return_storage_ptr__;
  }
LAB_0121d56a:
  operator_delete(local_48._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

string StructFilter::ToString(const string &column_name) const {
	if (!child_name.empty()) {
		return child_filter->ToString(column_name + "." + child_name);
	}
	return child_filter->ToString("struct_extract_at(" + column_name + "," + std::to_string(child_idx + 1) + ")");
}